

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_management.c
# Opt level: O1

ASYNC_OPERATION_HANDLE
amqp_management_execute_operation_async
          (AMQP_MANAGEMENT_HANDLE amqp_management,char *operation,char *type,char *locales,
          MESSAGE_HANDLE message,
          ON_AMQP_MANAGEMENT_EXECUTE_OPERATION_COMPLETE on_execute_operation_complete,
          void *on_execute_operation_complete_context)

{
  int iVar1;
  AMQP_VALUE in_RAX;
  LOGGER_LOG p_Var2;
  MESSAGE_HANDLE message_00;
  ASYNC_OPERATION_HANDLE async_operation;
  LIST_ITEM_HANDLE item;
  ASYNC_OPERATION_HANDLE pAVar3;
  char *pcVar4;
  AMQP_VALUE application_properties;
  
  if ((type == (char *)0x0 ||
      (operation == (char *)0x0 || amqp_management == (AMQP_MANAGEMENT_HANDLE)0x0)) ||
      on_execute_operation_complete == (ON_AMQP_MANAGEMENT_EXECUTE_OPERATION_COMPLETE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (ASYNC_OPERATION_HANDLE)0x0;
    }
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
              ,"amqp_management_execute_operation_async",0x494,1,
              "Bad arguments: amqp_management = %p, operation = %p, type = %p",amqp_management,
              operation,type);
    return (ASYNC_OPERATION_HANDLE)0x0;
  }
  if ((amqp_management->amqp_management_state & ~AMQP_MANAGEMENT_STATE_ERROR) ==
      AMQP_MANAGEMENT_STATE_IDLE) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (ASYNC_OPERATION_HANDLE)0x0;
    }
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
              ,"amqp_management_execute_operation_async",0x49c,1,
              "amqp_management_execute_operation_async called while not open or in error");
    return (ASYNC_OPERATION_HANDLE)0x0;
  }
  application_properties = in_RAX;
  if (message == (MESSAGE_HANDLE)0x0) {
    message_00 = message_create();
  }
  else {
    message_00 = message_clone(message);
    if (message_00 == (MESSAGE_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 == (LOGGER_LOG)0x0) {
        message_00 = (MESSAGE_HANDLE)0x0;
      }
      else {
        message_00 = (MESSAGE_HANDLE)0x0;
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                  ,"amqp_management_execute_operation_async",0x4af,1,"Could not clone message");
      }
    }
  }
  if (message_00 == (MESSAGE_HANDLE)0x0) {
    return (ASYNC_OPERATION_HANDLE)0x0;
  }
  iVar1 = message_get_application_properties(message_00,&application_properties);
  if (iVar1 == 0) {
    if (((application_properties == (AMQP_VALUE)0x0) &&
        (application_properties = amqpvalue_create_map(), application_properties == (AMQP_VALUE)0x0)
        ) && (p_Var2 = xlogging_get_log_function(), p_Var2 != (LOGGER_LOG)0x0)) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                ,"amqp_management_execute_operation_async",0x4c8,1,
                "Could not create application properties");
    }
    if (application_properties != (AMQP_VALUE)0x0) {
      iVar1 = add_string_key_value_pair_to_map(application_properties,"operation",operation);
      if (((iVar1 == 0) &&
          (iVar1 = add_string_key_value_pair_to_map(application_properties,"type",type), iVar1 == 0)
          ) && ((locales == (char *)0x0 ||
                (iVar1 = add_string_key_value_pair_to_map(application_properties,"locales",locales),
                iVar1 == 0)))) {
        iVar1 = message_set_application_properties(message_00,application_properties);
        if (iVar1 == 0) {
          iVar1 = set_message_id(message_00,amqp_management->next_message_id);
          if (iVar1 == 0) {
            async_operation = async_operation_create(amqp_management_execute_cancel_handler,0x40);
            if (async_operation == (ASYNC_OPERATION_HANDLE)0x0) {
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 != (LOGGER_LOG)0x0) {
                pcVar4 = "Failed allocating async result";
                iVar1 = 0x4f2;
                goto LAB_0012a6e6;
              }
            }
            else {
              async_operation[2].async_operation_cancel_handler =
                   (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)on_execute_operation_complete_context;
              async_operation[1].async_operation_cancel_handler =
                   (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)on_execute_operation_complete;
              async_operation[3].async_operation_cancel_handler =
                   (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)amqp_management->next_message_id;
              async_operation[5].async_operation_cancel_handler =
                   (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)amqp_management;
              *(undefined1 *)&async_operation[4].async_operation_cancel_handler = 0;
              async_operation[7].async_operation_cancel_handler =
                   (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)async_operation;
              item = singlylinkedlist_add(amqp_management->pending_operations,async_operation + 1);
              if (item == (LIST_ITEM_HANDLE)0x0) {
                p_Var2 = xlogging_get_log_function();
                if (p_Var2 != (LOGGER_LOG)0x0) {
                  (*p_Var2)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                            ,"amqp_management_execute_operation_async",0x505,1,
                            "Could not add the operation to the pending operations list.");
                }
              }
              else {
                pAVar3 = messagesender_send_async
                                   (amqp_management->message_sender,message_00,
                                    on_message_send_complete,item,0);
                async_operation[6].async_operation_cancel_handler =
                     (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)pAVar3;
                if (pAVar3 != (ASYNC_OPERATION_HANDLE)0x0) {
                  amqp_management->next_message_id = amqp_management->next_message_id + 1;
                  goto LAB_0012a65f;
                }
                p_Var2 = xlogging_get_log_function();
                if (p_Var2 != (LOGGER_LOG)0x0) {
                  (*p_Var2)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                            ,"amqp_management_execute_operation_async",0x511,1,
                            "Could not send request message");
                }
                singlylinkedlist_remove(amqp_management->pending_operations,item);
              }
              async_operation_destroy(async_operation);
            }
          }
          goto LAB_0012a65c;
        }
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_0012a65c;
        pcVar4 = "Could not set application properties";
        iVar1 = 0x4e5;
LAB_0012a6e6:
        async_operation = (ASYNC_OPERATION_HANDLE)0x0;
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                  ,"amqp_management_execute_operation_async",iVar1,1,pcVar4);
      }
      else {
LAB_0012a65c:
        async_operation = (ASYNC_OPERATION_HANDLE)0x0;
      }
LAB_0012a65f:
      amqpvalue_destroy(application_properties);
      goto LAB_0012a66d;
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      async_operation = (ASYNC_OPERATION_HANDLE)0x0;
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                ,"amqp_management_execute_operation_async",0x4bd,1,
                "Could not get application properties");
      goto LAB_0012a66d;
    }
  }
  async_operation = (ASYNC_OPERATION_HANDLE)0x0;
LAB_0012a66d:
  message_destroy(message_00);
  return async_operation;
}

Assistant:

ASYNC_OPERATION_HANDLE amqp_management_execute_operation_async(AMQP_MANAGEMENT_HANDLE amqp_management, const char* operation, const char* type, const char* locales, MESSAGE_HANDLE message, ON_AMQP_MANAGEMENT_EXECUTE_OPERATION_COMPLETE on_execute_operation_complete, void* on_execute_operation_complete_context)
{
    ASYNC_OPERATION_HANDLE result;
    
    if ((amqp_management == NULL) ||
        (operation == NULL) ||
        (type == NULL) ||
        (on_execute_operation_complete == NULL))
    {
        /* Codes_SRS_AMQP_MANAGEMENT_01_057: [ If `amqp_management`, `operation`, `type` or `on_execute_operation_complete` is NULL, `amqp_management_execute_operation_async` shall fail and return NULL. ]*/
        LogError("Bad arguments: amqp_management = %p, operation = %p, type = %p",
            amqp_management, operation, type);
        result = NULL;
    }
    /* Codes_SRS_AMQP_MANAGEMENT_01_081: [ If `amqp_management_execute_operation_async` is called when not OPEN, it shall fail and return NULL. ]*/
    else if ((amqp_management->amqp_management_state == AMQP_MANAGEMENT_STATE_IDLE) ||
        /* Codes_SRS_AMQP_MANAGEMENT_01_104: [ If `amqp_management_execute_operation_async` is called when the AMQP management is in error, it shall fail and return a non-zero value. ]*/
        (amqp_management->amqp_management_state == AMQP_MANAGEMENT_STATE_ERROR))
    {
        LogError("amqp_management_execute_operation_async called while not open or in error");
        result = NULL;
    }
    else
    {
        AMQP_VALUE application_properties;
        MESSAGE_HANDLE cloned_message;

        if (message == NULL)
        {
            /* Codes_SRS_AMQP_MANAGEMENT_01_102: [ If `message` is NULL, a new message shall be created by calling `message_create`. ]*/
            cloned_message = message_create();
        }
        else
        {
            /* Codes_SRS_AMQP_MANAGEMENT_01_103: [ Otherwise the existing message shall be cloned by using `message_clone` before being modified accordingly and used for the pending operation. ]*/
            cloned_message = message_clone(message);
            if (cloned_message == NULL)
            {
                LogError("Could not clone message");
            }
        }

        if (cloned_message == NULL)
        {
            result = NULL;
        }
        else
        {
            /* Codes_SRS_AMQP_MANAGEMENT_01_055: [ `amqp_management_execute_operation_async` shall start an AMQP management operation. ]*/
            /* Codes_SRS_AMQP_MANAGEMENT_01_082: [ `amqp_management_execute_operation_async` shall obtain the application properties from the message by calling `message_get_application_properties`. ]*/
            if (message_get_application_properties(cloned_message, &application_properties) != 0)
            {
                LogError("Could not get application properties");
                result = NULL;
            }
            else
            {
                if (application_properties == NULL)
                {
                    /* Codes_SRS_AMQP_MANAGEMENT_01_083: [ If no application properties were set on the message, a new application properties instance shall be created by calling `amqpvalue_create_map`; ]*/
                    application_properties = amqpvalue_create_map();
                    if (application_properties == NULL)
                    {
                        LogError("Could not create application properties");
                    }
                }

                if (application_properties == NULL)
                {
                    result = NULL;
                }
                else
                {
                    /* Codes_SRS_AMQP_MANAGEMENT_01_084: [ For each of the arguments `operation`, `type` and `locales` an AMQP value of type string shall be created by calling `amqpvalue_create_string` in order to be used as key in the application properties map. ]*/
                    /* Codes_SRS_AMQP_MANAGEMENT_01_085: [ For each of the arguments `operation`, `type` and `locales` an AMQP value of type string containing the argument value shall be created by calling `amqpvalue_create_string` in order to be used as value in the application properties map. ]*/
                    /* Codes_SRS_AMQP_MANAGEMENT_01_058: [ Request messages have the following application-properties: ]*/
                    /* Codes_SRS_AMQP_MANAGEMENT_01_059: [ operation string Yes The management operation to be performed. ] */
                    if ((add_string_key_value_pair_to_map(application_properties, "operation", operation) != 0) ||
                        /* Codes_SRS_AMQP_MANAGEMENT_01_061: [ type string Yes The Manageable Entity Type of the Manageable Entity to be managed. ]*/
                        (add_string_key_value_pair_to_map(application_properties, "type", type) != 0) ||
                        /* Codes_SRS_AMQP_MANAGEMENT_01_093: [ If `locales` is NULL, no key/value pair shall be added for it in the application properties map. ]*/
                        /* Codes_SRS_AMQP_MANAGEMENT_01_063: [ locales string No A list of locales that the sending peer permits for incoming informational text in response messages. ]*/
                        ((locales != NULL) && (add_string_key_value_pair_to_map(application_properties, "locales", locales) != 0)))
                    {
                        result = NULL;
                    }
                    else
                    {
                        /* Codes_SRS_AMQP_MANAGEMENT_01_087: [ The application properties obtained after adding the key/value pairs shall be set on the message by calling `message_set_application_properties`. ]*/
                        if (message_set_application_properties(cloned_message, application_properties) != 0)
                        {
                            /* Codes_SRS_AMQP_MANAGEMENT_01_090: [ If any APIs used to create and set the application properties on the message fails, `amqp_management_execute_operation_async` shall fail and return NULL. ]*/
                            LogError("Could not set application properties");
                            result = NULL;
                        }
                        else if (set_message_id(cloned_message, amqp_management->next_message_id) != 0)
                        {
                            result = NULL;
                        }
                        else
                        {
                            result = CREATE_ASYNC_OPERATION(OPERATION_MESSAGE_INSTANCE, amqp_management_execute_cancel_handler);

                            if (result == NULL)
                            {
                                LogError("Failed allocating async result");
                            }
                            else
                            {
                                OPERATION_MESSAGE_INSTANCE* pending_operation_message = GET_ASYNC_OPERATION_CONTEXT(OPERATION_MESSAGE_INSTANCE, result);

                                LIST_ITEM_HANDLE added_item;
                                pending_operation_message->callback_context = on_execute_operation_complete_context;
                                pending_operation_message->on_execute_operation_complete = on_execute_operation_complete;
                                pending_operation_message->message_id = amqp_management->next_message_id;
                                pending_operation_message->amqp_management = amqp_management;
                                pending_operation_message->message_send_confirmed = false;
                                pending_operation_message->execute_async_operation = result;

                                /* Codes_SRS_AMQP_MANAGEMENT_01_091: [ Once the request message has been sent, an entry shall be stored in the pending operations list by calling `singlylinkedlist_add`. ]*/
                                added_item = singlylinkedlist_add(amqp_management->pending_operations, pending_operation_message);
                                if (added_item == NULL)
                                {
                                    /* Codes_SRS_AMQP_MANAGEMENT_01_092: [ If `singlylinkedlist_add` fails then `amqp_management_execute_operation_async` shall fail and return a non-zero value. ]*/
                                    LogError("Could not add the operation to the pending operations list.");
                                    async_operation_destroy(result);
                                    result = NULL;
                                }
                                else
                                {
                                    /* Codes_SRS_AMQP_MANAGEMENT_01_088: [ `amqp_management_execute_operation_async` shall send the message by calling `messagesender_send_async`. ]*/
                                    /* Codes_SRS_AMQP_MANAGEMENT_01_166: [ The `on_message_send_complete` callback shall be passed to the `messagesender_send_async` call. ]*/
                                    pending_operation_message->send_async_context = messagesender_send_async(amqp_management->message_sender, cloned_message, on_message_send_complete, added_item, 0);
                                    if (pending_operation_message->send_async_context == NULL)
                                    {
                                        /* Codes_SRS_AMQP_MANAGEMENT_01_089: [ If `messagesender_send_async` fails, `amqp_management_execute_operation_async` shall fail and return NULL. ]*/
                                        LogError("Could not send request message");
                                        (void)singlylinkedlist_remove(amqp_management->pending_operations, added_item);
                                        async_operation_destroy(result);
                                        result = NULL;
                                    }
                                    else
                                    {
                                        /* Codes_SRS_AMQP_MANAGEMENT_01_107: [ The message Id set on the message properties shall be incremented with each operation. ]*/
                                        amqp_management->next_message_id++;
                                    }
                                }
                            }
                        }
                    }

                    /* Codes_SRS_AMQP_MANAGEMENT_01_101: [ After setting the application properties, the application properties instance shall be freed by `amqpvalue_destroy`. ]*/
                    amqpvalue_destroy(application_properties);
                }
            }

            message_destroy(cloned_message);
        }
    }
    return result;
}